

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O0

void * __thiscall Centaurus::Stage1Runner::feed_callback(Stage1Runner *this)

{
  void *pvVar1;
  Stage1Runner *this_local;
  
  release_bank(this);
  pvVar1 = acquire_bank(this);
  return pvVar1;
}

Assistant:

virtual void *feed_callback() override
  {
    release_bank();
    return acquire_bank();
  }